

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall
sglr::ReferenceContext::renderbufferStorage
          (ReferenceContext *this,deUint32 target,deUint32 internalformat,int width,int height)

{
  deBool dVar1;
  TextureFormat local_28;
  TextureFormat format;
  int height_local;
  int width_local;
  deUint32 internalformat_local;
  deUint32 target_local;
  ReferenceContext *this_local;
  
  format.order = height;
  format.type = width;
  local_28 = glu::mapGLInternalFormat(internalformat);
  do {
    if (target != 0x8d41) {
      setError(this,0x500);
      return;
    }
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  do {
    if (this->m_renderbufferBinding == (Renderbuffer *)0x0) {
      setError(this,0x502);
      return;
    }
    dVar1 = ::deGetFalse();
  } while (dVar1 != 0);
  while ((dVar1 = deInRange32(format.type,0,(this->m_limits).maxRenderbufferSize), dVar1 != 0 &&
         (dVar1 = deInRange32(format.order,0,(this->m_limits).maxRenderbufferSize), dVar1 != 0))) {
    dVar1 = ::deGetFalse();
    if (dVar1 == 0) {
      while ((local_28.order != CHANNELORDER_LAST && (local_28.type != CHANNELTYPE_LAST))) {
        dVar1 = ::deGetFalse();
        if (dVar1 == 0) {
          rc::Renderbuffer::setStorage
                    (this->m_renderbufferBinding,&local_28,format.type,format.order);
          return;
        }
      }
      setError(this,0x500);
      return;
    }
  }
  setError(this,0x502);
  return;
}

Assistant:

void ReferenceContext::renderbufferStorage (deUint32 target, deUint32 internalformat, int width, int height)
{
	TextureFormat format = glu::mapGLInternalFormat(internalformat);

	RC_IF_ERROR(target != GL_RENDERBUFFER, GL_INVALID_ENUM, RC_RET_VOID);
	RC_IF_ERROR(!m_renderbufferBinding, GL_INVALID_OPERATION, RC_RET_VOID);
	RC_IF_ERROR(!deInRange32(width, 0, m_limits.maxRenderbufferSize) ||
				!deInRange32(height, 0, m_limits.maxRenderbufferSize),
				GL_INVALID_OPERATION, RC_RET_VOID);
	RC_IF_ERROR(format.order == TextureFormat::CHANNELORDER_LAST ||
				format.type == TextureFormat::CHANNELTYPE_LAST, GL_INVALID_ENUM, RC_RET_VOID);

	m_renderbufferBinding->setStorage(format, (int)width, (int)height);
}